

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.h
# Opt level: O2

void __thiscall
CCoinsCacheEntry::AddFlags
          (CCoinsCacheEntry *this,uint8_t flags,CoinsCachePair *self,CoinsCachePair *sentinel)

{
  byte bVar1;
  long lVar2;
  undefined3 in_register_00000031;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = this->m_flags;
  if (CONCAT31(in_register_00000031,flags) != 0 && bVar1 == 0) {
    this->m_prev = (sentinel->second).m_prev;
    this->m_next = sentinel;
    (sentinel->second).m_prev = self;
    (this->m_prev->second).m_next = self;
  }
  this->m_flags = bVar1 | flags;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void AddFlags(uint8_t flags, CoinsCachePair& self, CoinsCachePair& sentinel) noexcept
    {
        Assume(&self.second == this);
        if (!m_flags && flags) {
            m_prev = sentinel.second.m_prev;
            m_next = &sentinel;
            sentinel.second.m_prev = &self;
            m_prev->second.m_next = &self;
        }
        m_flags |= flags;
    }